

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Symbol_init(void)

{
  s_x2node *psVar1;
  int local_c;
  int i;
  
  if ((x2a == (s_x2 *)0x0) && (x2a = (s_x2 *)malloc(0x18), x2a != (s_x2 *)0x0)) {
    x2a->size = 0x80;
    x2a->count = 0;
    psVar1 = (s_x2node *)calloc(0x80,0x28);
    x2a->tbl = psVar1;
    if (x2a->tbl == (s_x2node *)0x0) {
      free(x2a);
      x2a = (s_x2 *)0x0;
    }
    else {
      x2a->ht = (s_x2node **)(x2a->tbl + 0x80);
      for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
        x2a->ht[local_c] = (s_x2node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Symbol_init(){
  if( x2a ) return;
  x2a = (struct s_x2*)malloc( sizeof(struct s_x2) );
  if( x2a ){
    x2a->size = 128;
    x2a->count = 0;
    x2a->tbl = (x2node*)calloc(128, sizeof(x2node) + sizeof(x2node*));
    if( x2a->tbl==0 ){
      free(x2a);
      x2a = 0;
    }else{
      int i;
      x2a->ht = (x2node**)&(x2a->tbl[128]);
      for(i=0; i<128; i++) x2a->ht[i] = 0;
    }
  }
}